

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O0

void tok_str_add2(TokenString *s,int t,CValue *cv)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  size_t nb_words;
  int *str;
  int len;
  CValue *cv_local;
  int t_local;
  TokenString *s_local;
  
  iVar1 = s->len;
  s->lastlen = iVar1;
  nb_words = (size_t)s->str;
  if (s->allocated_len <= iVar1 + 4) {
    nb_words = (size_t)tok_str_realloc(s,iVar1 + 5);
  }
  iVar4 = iVar1 + 1;
  *(int *)(nb_words + (long)iVar1 * 4) = t;
  switch(t) {
  case 0xb3:
  case 0xb4:
  case 0xb5:
  case 0xb6:
  case 0xbb:
  case 0xc0:
    str._4_4_ = iVar1 + 2;
    *(float *)(nb_words + (long)iVar4 * 4) = cv->f;
    break;
  case 0xb7:
  case 0xb8:
  case 0xbc:
  case 0xce:
  case 0xcf:
    *(float *)(nb_words + (long)iVar4 * 4) = cv->f;
    str._4_4_ = iVar1 + 3;
    *(int *)(nb_words + (long)(iVar1 + 2) * 4) = cv->tab[1];
    break;
  case 0xb9:
  case 0xba:
  case 0xbe:
  case 0xbf:
    lVar3 = ((long)(cv->str).size + 3U >> 2) + 1;
    iVar2 = (int)lVar3;
    if ((ulong)(long)s->allocated_len <= (ulong)(iVar4 + lVar3)) {
      nb_words = (size_t)tok_str_realloc(s,iVar4 + iVar2 + 1);
    }
    *(float *)(nb_words + (long)iVar4 * 4) = cv->f;
    memcpy((void *)(nb_words + (long)(iVar1 + 2) * 4),(cv->str).data,(long)(cv->str).size);
    str._4_4_ = iVar4 + iVar2;
    break;
  case 0xbd:
    *(float *)(nb_words + (long)iVar4 * 4) = cv->f;
    *(int *)(nb_words + (long)(iVar1 + 2) * 4) = cv->tab[1];
    *(int *)(nb_words + (long)(iVar1 + 3) * 4) = cv->tab[2];
    str._4_4_ = iVar1 + 5;
    *(int *)(nb_words + (long)(iVar1 + 4) * 4) = cv->tab[3];
    break;
  default:
    str._4_4_ = iVar4;
  }
  s->len = str._4_4_;
  return;
}

Assistant:

static void tok_str_add2(TokenString* s, int t, CValue* cv) {
  int len, *str;

  len = s->lastlen = s->len;
  str = s->str;

  /* allocate space for worst case */
  if (len + TOK_MAX_SIZE >= s->allocated_len)
    str = tok_str_realloc(s, len + TOK_MAX_SIZE + 1);
  str[len++] = t;
  switch (t) {
    case TOK_CINT:
    case TOK_CUINT:
    case TOK_CCHAR:
    case TOK_LCHAR:
    case TOK_CFLOAT:
    case TOK_LINENUM:
#if LONG_SIZE == 4
    case TOK_CLONG:
    case TOK_CULONG:
#endif
      str[len++] = cv->tab[0];
      break;
    case TOK_PPNUM:
    case TOK_PPSTR:
    case TOK_STR:
    case TOK_LSTR: {
      /* Insert the string into the int array. */
      size_t nb_words = 1 + (cv->str.size + sizeof(int) - 1) / sizeof(int);
      if (len + nb_words >= s->allocated_len)
        str = tok_str_realloc(s, len + nb_words + 1);
      str[len] = cv->str.size;
      memcpy(&str[len + 1], cv->str.data, cv->str.size);
      len += nb_words;
    } break;
    case TOK_CDOUBLE:
    case TOK_CLLONG:
    case TOK_CULLONG:
#if LONG_SIZE == 8
    case TOK_CLONG:
    case TOK_CULONG:
#endif
#if LDOUBLE_SIZE == 8
    case TOK_CLDOUBLE:
#endif
      str[len++] = cv->tab[0];
      str[len++] = cv->tab[1];
      break;
#if LDOUBLE_SIZE == 12
    case TOK_CLDOUBLE:
      str[len++] = cv->tab[0];
      str[len++] = cv->tab[1];
      str[len++] = cv->tab[2];
#elif LDOUBLE_SIZE == 16
    case TOK_CLDOUBLE:
      str[len++] = cv->tab[0];
      str[len++] = cv->tab[1];
      str[len++] = cv->tab[2];
      str[len++] = cv->tab[3];
#elif LDOUBLE_SIZE != 8
#error add long double size support
#endif
      break;
    default:
      break;
  }
  s->len = len;
}